

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O1

int FeederBigRand1(void)

{
  DWORD DVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  DWORD DVar5;
  FILE *__stream;
  size_t sVar6;
  char pattern [17];
  char local_48 [24];
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
  }
  else {
    if (testN - 0x10U < 2) {
      uVar3 = seed[testN - 0x10U];
      printf("Creating large text with seed %u... ",(ulong)uVar3);
      fflush(_stdout);
      builtin_strncpy(local_48,"0123456789abcdef",0x11);
      srand(uVar3);
      DVar1 = GetTickCount();
      iVar2 = fputs(local_48,__stream);
      if ((iVar2 != -1) && (iVar2 = fputc(10,__stream), iVar2 != -1)) {
        iVar2 = 0x7fffff;
        do {
          uVar3 = rand();
          uVar3 = uVar3 % 0x11;
          if (uVar3 == 0) {
            iVar4 = putc(0x20,__stream);
            if (iVar4 == -1) goto LAB_0010267b;
          }
          else {
            sVar6 = fwrite(local_48,1,(ulong)uVar3,__stream);
            if (sVar6 != uVar3) goto LAB_0010267b;
          }
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        iVar2 = fputs(local_48,__stream);
        if (iVar2 != -1) {
          fclose(__stream);
          DVar5 = GetTickCount();
          uVar3 = RoundUptoThousand(DVar5 - DVar1);
          printf("done in T=%u seconds. Starting exe with timeout 6*T... ",(ulong)uVar3 / 1000);
          LabTimeout = uVar3 * 6;
          fflush(_stdout);
          return 0;
        }
      }
LAB_0010267b:
      puts("can\'t write in in.txt. No space on disk?");
    }
    else {
      puts("\nInternal error: incorrect test number");
      testN = testN + 1;
    }
    fclose(__stream);
  }
  return -1;
}

Assistant:

static int FeederBigRand1(void) {
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    unsigned int bigTestN = testN - sizeof(testInOut) / sizeof(testInOut[0]);
    if (bigTestN >= sizeof(seed) / sizeof(seed[0])) {
        printf("\nInternal error: incorrect test number\n");
        ++testN;
        fclose(in);
        return -1;
    }
    printf("Creating large text with seed %u... ", seed[bigTestN]);
    fflush(stdout);
    const char pattern[] = "0123456789abcdef";
    srand(seed[bigTestN]);
    DWORD t = GetTickCount();
    if (fputs(pattern, in) == EOF || fputc('\n',in) == EOF) {
        printf("can't write in in.txt. No space on disk?\n");
        fclose(in);
        return -1;
    }
    for (unsigned int i = 1; i < 1024 * 1024 * 8; ++i) {
        unsigned int randomPrefixLength = (unsigned int)rand() % 17;
        if (randomPrefixLength == 0) {
            if (putc(' ', in) == EOF) {
                printf("can't write in in.txt. No space on disk?\n");
                fclose(in);
                return -1;
            }
        } else {
            if (fwrite(pattern, 1, randomPrefixLength, in) != randomPrefixLength) {
                printf("can't write in in.txt. No space on disk?\n");
                fclose(in);
                return -1;
            }
        }

    }
    if (fputs(pattern, in) == EOF) {
        printf("can't write in in.txt. No space on disk?\n");
        fclose(in);
        return -1;
    }
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 6*T... ", (unsigned)(t / 1000));
    LabTimeout = (int)t * 6;
    fflush(stdout);
    return 0;
}